

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbutil.c
# Opt level: O3

void ga_init_nbhandle(Integer *nbhandle)

{
  undefined8 in_RAX;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  gai_nbhdl_t *oldhdl;
  Integer itmp;
  uint local_28;
  undefined4 uStack_24;
  
  uVar3 = (long)(lastGAhandle + 1) % (long)nb_max_outstanding;
  lastGAhandle = (int)uVar3;
  uVar4 = lastGAhandle;
  if (0 < nb_max_outstanding) {
    uVar3 = uVar3 & 0xffffffff;
    do {
      uVar4 = (int)uVar3 % nb_max_outstanding;
      if (ga_ihdl_array[(int)uVar4].ahandle == (ga_armcihdl_t *)0x0) break;
      uVar1 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar1;
      uVar4 = lastGAhandle;
    } while ((int)uVar1 < lastGAhandle + nb_max_outstanding);
  }
  if (ga_ihdl_array[(int)uVar4].ahandle != (ga_armcihdl_t *)0x0) {
    _local_28 = CONCAT44((int)((ulong)in_RAX >> 0x20),
                         ga_ihdl_array[(int)uVar4].ga_nbtag << 8 | uVar4 & 0xff);
    nga_wait_internal((Integer *)&local_28);
  }
  uVar1 = ga_nb_tag + 1;
  uVar2 = uVar1 & 0xffffff;
  ga_nb_tag = uVar2;
  *(uint *)nbhandle = uVar1 * 0x100 | uVar4 & 0xff;
  ga_ihdl_array[(int)uVar4].ahandle = (ga_armcihdl_t *)0x0;
  ga_ihdl_array[(int)uVar4].count = 0;
  ga_ihdl_array[(int)uVar4].active = 1;
  ga_ihdl_array[(int)uVar4].ga_nbtag = uVar2;
  lastGAhandle = uVar4;
  return;
}

Assistant:

void ga_init_nbhandle(Integer *nbhandle)
{
  int i, top, idx, iloc;
  gai_nbhdl_t *inbhandle = (gai_nbhdl_t *)nbhandle;
  lastGAhandle++;
  lastGAhandle = lastGAhandle%nb_max_outstanding;
  top = lastGAhandle+nb_max_outstanding;
  /* default index if no handles are available */
  idx = lastGAhandle;
  for (i=lastGAhandle; i<top; i++) {
    iloc = i%nb_max_outstanding;
    if (ga_ihdl_array[iloc].ahandle == NULL) {
      idx = iloc;
      break;
    }
  }
  /* If no free handle is found, clear the oldest handle */
  if (ga_ihdl_array[idx].ahandle != NULL) {
    Integer itmp;
    /* find value of itmp corresponding to oldest handle */
    gai_nbhdl_t *oldhdl = (gai_nbhdl_t*)&itmp;
    oldhdl->ihdl_index = idx;
    oldhdl->ga_nbtag = ga_ihdl_array[idx].ga_nbtag;
    nga_wait_internal(&itmp);
  }
  inbhandle->ihdl_index = idx;
  inbhandle->ga_nbtag = get_next_tag();
  ga_ihdl_array[idx].ahandle = NULL;
  ga_ihdl_array[idx].count = 0;
  ga_ihdl_array[idx].active = 1;
  ga_ihdl_array[idx].ga_nbtag = inbhandle->ga_nbtag;

  /* reset lastGAhandle to idx */
  lastGAhandle = idx;
  return;
}